

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.h
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevCollection::solve_for_x
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevCollection *this
          ,double y)

{
  pointer pCVar1;
  iterator __position;
  pointer pdVar2;
  double *rt;
  pointer __args;
  pointer this_00;
  vector<double,_std::allocator<double>_> local_90;
  double local_78;
  ChebyshevExpansion local_70;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->m_exps).
            super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->m_exps).
           super__Vector_base<ChebTools::ChebyshevExpansion,_std::allocator<ChebTools::ChebyshevExpansion>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pCVar1) {
    local_78 = y;
    do {
      ChebyshevExpansion::operator-(&local_70,this_00,local_78);
      ChebyshevExpansion::real_roots2(&local_90,&local_70,true);
      free(local_70.m_nodal_value_cache.
           super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(local_70.m_recurrence_buffer.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(local_70.m_c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      pdVar2 = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (__args = local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start; __args != pdVar2; __args = __args + 1) {
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                     __args);
        }
        else {
          *__position._M_current = *__args;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pCVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto solve_for_x(double y) const {
            std::vector<double> solns;
            for (auto& ex : m_exps) {
                bool only_in_domain = true;
                for (auto& rt : (ex - y).real_roots2(only_in_domain)) {
                    solns.emplace_back(rt);
                }
            }
            return solns;
        }